

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O1

void decode_ustr(Symbol *sym,double *pg1,double *pg2,char *s)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  
  uVar1 = sym->subtype;
  switch((ulong)((uint)uVar1 & 0x1e) - 2 >> 1) {
  case 0:
    if ((sym == (Symbol *)0x0) || ((sym->u).str == (char *)0x0)) {
      __assert_fail("sym && sym->u.str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x72f,"void decode_ustr()");
    }
    pcVar7 = "[%*d]\n%lf\n%s";
    if ((uVar1 & 0x20) == 0) {
      pcVar7 = "%lf\n%s";
    }
    iVar2 = __isoc99_sscanf((sym->u).str,pcVar7,pg1,s);
    if (iVar2 == 1) {
      *s = '\0';
      iVar2 = 2;
    }
    if (iVar2 != 2) {
      __assert_fail("i == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x739,"void decode_ustr()");
    }
    break;
  case 1:
  case 3:
  case 7:
    if ((sym == (Symbol *)0x0) || ((sym->u).str == (char *)0x0)) {
      __assert_fail("sym && sym->u.str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x71c,"void decode_ustr()");
    }
    pcVar7 = "[%*d]\n%lf%*c%lf";
    if ((uVar1 & 0x20) == 0) {
      pcVar7 = "%lf%*c%lf";
    }
    uVar6 = 0;
    iVar2 = __isoc99_sscanf((sym->u).str,pcVar7,pg1,pg2);
    if (iVar2 != 2) {
      __assert_fail("i == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x722,"void decode_ustr()");
    }
    pcVar7 = (sym->u).str;
    do {
      pcVar3 = pcVar7;
      uVar6 = uVar6 + (*pcVar3 == '\n');
      pcVar7 = pcVar3 + 1;
    } while (uVar6 < 2);
    cVar5 = pcVar3[1];
    pcVar7 = s;
    if (cVar5 != '\n') {
      lVar4 = 0;
      do {
        s[lVar4] = cVar5;
        cVar5 = pcVar3[lVar4 + 2];
        lVar4 = lVar4 + 1;
      } while (cVar5 != '\n');
      pcVar7 = s + lVar4;
    }
    *pcVar7 = '\0';
    break;
  default:
    diag(sym->name," does not have a proper declaration");
  }
  if (*s == '0') {
    *s = '\0';
  }
  return;
}

Assistant:

void decode_ustr(sym, pg1, pg2, s)	/* decode sym->u.str */
	Symbol *sym;
	char *s;
	double *pg1, *pg2;
{
	int i, n;
	char *cp, *cp1;
	
	switch (sym->subtype & (INDEP | DEP | STAT | PARM)) {

	case INDEP:	/* but doesnt get all info */
	case DEP:
	case STAT:
		assert(sym && sym->u.str);
		if (sym->subtype & ARRAY) { /* see parsact.c */
			i = sscanf(sym->u.str, "[%*d]\n%lf%*c%lf", pg1, pg2);
		}else{			
			i = sscanf(sym->u.str, "%lf%*c%lf", pg1, pg2);
		}
		assert(i == 2);
		for (n=0, cp = sym->u.str; n < 2;) {
			if (*cp++ == '\n') {
				n++;
			}
		}
		for (cp1 = s; *cp != '\n';) {
			*cp1++ = *cp++;
		}
		*cp1 = '\0';
		break;

	case PARM:
		assert(sym && sym->u.str);
		if (sym->subtype & ARRAY) { /* see parsact.c */
			i = sscanf(sym->u.str, "[%*d]\n%lf\n%s", pg1, s);
		}else{			
			i = sscanf(sym->u.str, "%lf\n%s", pg1, s);
		}
		if (i == 1) {
			s[0] = '\0';
			i = 2;
		}
		assert(i == 2);
		break;
	default:
		diag(sym->name, " does not have a proper declaration");
	}
	if (s[0] == '0') {s[0] = '\0';}
}